

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall write_wallmark::operator()(write_wallmark *this,wm_object *wm,xr_writer *w)

{
  pointer pwVar1;
  pointer pwVar2;
  float local_1c;
  
  local_1c = (float)CONCAT31(local_1c._1_3_,wm->selected);
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  local_1c = (wm->bbox).field_0.field_1.x1;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bbox).field_0.field_1.y1;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bbox).field_0.field_1.z1;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bbox).field_0.field_1.x2;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bbox).field_0.field_1.y2;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bbox).field_0.field_1.z2;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bsphere).p.field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bsphere).p.field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bsphere).p.field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bsphere).r;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = wm->width;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = wm->height;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = wm->rotate;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)((int)((ulong)((long)(wm->vertices).
                                         super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(wm->vertices).
                                        super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  pwVar1 = (wm->vertices).
           super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pwVar2 = (wm->vertices).
           super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pwVar1 != pwVar2) {
    (*w->_vptr_xr_writer[2])(w,pwVar1,(long)pwVar2 - (long)pwVar1);
  }
  return;
}

Assistant:

void operator()(const wm_object& wm, xr_writer& w) const {
	w.w_bool(wm.selected);
	w.w_fvector3(wm.bbox.min);
	w.w_fvector3(wm.bbox.max);
	w.w_fvector3(wm.bsphere.p);
	w.w_float(wm.bsphere.r);
	w.w_float(wm.width);
	w.w_float(wm.height);
	w.w_float(wm.rotate);
	w.w_size_u32(wm.vertices.size());
	w.w_seq(wm.vertices);
}